

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Array<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  size_t __n;
  long lVar1;
  String *pSVar2;
  RemoveConst<kj::String> *pRVar3;
  String *pSVar4;
  Array<kj::String> *pAVar5;
  int iVar6;
  int iVar7;
  __off64_t _Var8;
  DIR *__dirp;
  int *piVar9;
  dirent64 *pdVar10;
  size_t size;
  ulong uVar11;
  size_t sVar12;
  Array<kj::String> *result;
  Vector<kj::String> entries;
  Fault f;
  Fault f_3;
  Vector<kj::String> local_78;
  String local_58;
  Fault local_40;
  Array<kj::String> *local_38;
  
  do {
    _Var8 = lseek64((this->fd).fd,0,0);
    if (-1 < _Var8) {
      iVar6 = 0;
      break;
    }
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_58);
  }
  do {
    iVar6 = dup((this->fd).fd);
    if (-1 < iVar6) {
      iVar7 = 0;
      break;
    }
    iVar7 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar7 == -1);
  if (iVar7 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_38 = __return_storage_ptr__;
  __dirp = fdopendir(iVar6);
  if (__dirp == (DIR *)0x0) {
    close(iVar6);
    __errno_location();
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_78.builder.ptr = (String *)0x0;
  local_78.builder.pos = (String *)0x0;
  local_78.builder.endPtr = (String *)0x0;
  local_78.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  piVar9 = __errno_location();
LAB_00207033:
  *piVar9 = 0;
  pdVar10 = readdir64(__dirp);
  pAVar5 = local_38;
  if (pdVar10 == (dirent64 *)0x0) {
    if (*piVar9 != 0) {
      local_40.exception = (Exception *)0x0;
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
    if (local_78.builder.pos != local_78.builder.endPtr) {
      Vector<kj::String>::setCapacity
                (&local_78,
                 ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                 -0x5555555555555555);
    }
    pRVar3 = local_78.builder.pos;
    pSVar2 = local_78.builder.ptr;
    uVar11 = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) * -0x5555555555555555;
    pAVar5->ptr = local_78.builder.ptr;
    pAVar5->size_ = uVar11;
    pAVar5->disposer = local_78.builder.disposer;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_78.builder.endPtr = (String *)0x0;
    if (pRVar3 != pSVar2) {
      lVar1 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::__introsort_loop<kj::String*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar2,pRVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<kj::String*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar2,pRVar3);
    }
    pSVar4 = local_78.builder.endPtr;
    pRVar3 = local_78.builder.pos;
    pSVar2 = local_78.builder.ptr;
    if (local_78.builder.ptr != (String *)0x0) {
      local_78.builder.ptr = (String *)0x0;
      local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
      local_78.builder.endPtr = (String *)0x0;
      (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
                (local_78.builder.disposer,pSVar2,0x18,
                 ((long)pRVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
                 ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
    }
    closedir(__dirp);
    return pAVar5;
  }
  __s = pdVar10->d_name;
  size = strlen(__s);
  __n = size + 1;
  if (size == 2) goto LAB_0020708a;
  if (size == 1) goto code_r0x0020706e;
  goto LAB_002070a0;
code_r0x0020706e:
  iVar6 = bcmp(__s,".",__n);
  if (iVar6 != 0) {
    if (__n == 3) {
LAB_0020708a:
      iVar6 = bcmp(__s,"..",__n);
      if (iVar6 == 0) goto LAB_00207033;
    }
LAB_002070a0:
    if ((size < 8) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
      if (pdVar10->d_type == '\0') {
        heapString(&local_58,__s,size);
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar12 = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                   0x5555555555555556;
          if (local_78.builder.endPtr == local_78.builder.ptr) {
            sVar12 = 4;
          }
          Vector<kj::String>::setCapacity(&local_78,sVar12);
        }
      }
      else {
        heapString(&local_58,__s,size);
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar12 = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                   0x5555555555555556;
          if (local_78.builder.endPtr == local_78.builder.ptr) {
            sVar12 = 4;
          }
          Vector<kj::String>::setCapacity(&local_78,sVar12);
        }
      }
      ((local_78.builder.pos)->content).ptr = local_58.content.ptr;
      ((local_78.builder.pos)->content).size_ = local_58.content.size_;
      ((local_78.builder.pos)->content).disposer = local_58.content.disposer;
      local_78.builder.pos = local_78.builder.pos + 1;
    }
  }
  goto LAB_00207033;
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }